

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDataStack.h
# Opt level: O3

void __thiscall
HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
          (HighsDataStack *this,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *r)

{
  pointer pcVar1;
  size_type __new_size;
  pointer pNVar2;
  size_t sVar3;
  
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = this->position;
  this->position = sVar3 - 8;
  __new_size = *(size_type *)(pcVar1 + (sVar3 - 8));
  if (__new_size != 0) {
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ::resize(r,__new_size);
    sVar3 = this->position + __new_size * -0x10;
    this->position = sVar3;
    memcpy((r->
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           )._M_impl.super__Vector_impl_data._M_start,
           (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + sVar3,__new_size * 0x10);
    return;
  }
  pNVar2 = (r->
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((r->
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      )._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
    (r->
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    )._M_impl.super__Vector_impl_data._M_finish = pNVar2;
  }
  return;
}

Assistant:

void pop(std::vector<T>& r) {
    // pop the vector size
    position -= sizeof(std::size_t);
    std::size_t numData;
    std::memcpy(&numData, &data[position], sizeof(std::size_t));
    // pop the data
    if (numData == 0) {
      r.clear();
    } else {
      r.resize(numData);
      position -= numData * sizeof(T);
      std::memcpy(r.data(), data.data() + position, numData * sizeof(T));
    }
  }